

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

void Mem_StepStop(Mem_Step_t *p,int fVerbose)

{
  int iVar1;
  void **__ptr;
  long lVar2;
  
  if (0 < p->nMems) {
    lVar2 = 0;
    do {
      Mem_FixedStop(p->pMems[lVar2],fVerbose);
      lVar2 = lVar2 + 1;
    } while (lVar2 < p->nMems);
  }
  __ptr = p->pLargeChunks;
  if (__ptr != (void **)0x0) {
    iVar1 = p->nLargeChunks;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (p->pLargeChunks[lVar2] != (void *)0x0) {
          free(p->pLargeChunks[lVar2]);
          p->pLargeChunks[lVar2] = (void *)0x0;
          iVar1 = p->nLargeChunks;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
      __ptr = p->pLargeChunks;
      if (__ptr == (void **)0x0) goto LAB_004b85c2;
    }
    free(__ptr);
    p->pLargeChunks = (void **)0x0;
  }
LAB_004b85c2:
  if (p->pMems != (Mem_Fixed_t **)0x0) {
    free(p->pMems);
    p->pMems = (Mem_Fixed_t **)0x0;
  }
  if (p->pMap != (Mem_Fixed_t **)0x0) {
    free(p->pMap);
  }
  free(p);
  return;
}

Assistant:

void Mem_StepStop( Mem_Step_t * p, int fVerbose )
{
    int i;
    for ( i = 0; i < p->nMems; i++ )
        Mem_FixedStop( p->pMems[i], fVerbose );
    if ( p->pLargeChunks ) 
    {
        for ( i = 0; i < p->nLargeChunks; i++ )
            ABC_FREE( p->pLargeChunks[i] );
        ABC_FREE( p->pLargeChunks );
    }
    ABC_FREE( p->pMems );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}